

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsGL
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  IPipelineResourceSignature **ppIVar1;
  SHADER_TYPE SVar2;
  BINDING_RANGE BVar3;
  SerializedResourceSignatureImpl *this;
  PipelineResourceSignatureDesc *pPVar4;
  PipelineResourceSignatureGLImpl *pPVar5;
  PipelineResourceDesc *Desc;
  PipelineResourceAttribsType *pPVar6;
  char (*in_RCX) [19];
  SHADER_TYPE Stages;
  uint uVar7;
  uint uVar8;
  SHADER_TYPE SVar9;
  char (*in_R8) [3];
  ulong uVar10;
  Uint8 *Args;
  TBindings BaseBindings;
  string msg;
  array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL> local_78;
  
  SVar9 = Info->ShaderStages;
  SVar2 = SVar9 & (SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS);
  local_78._M_elems[6].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[7].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[4].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[5].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[2].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[3].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[0].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78._M_elems[1].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  ppIVar1 = Info->ppResourceSignatures;
  uVar8 = Info->ResourceSignaturesCount;
  uVar7 = 0;
  for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    this = ClassPtrCast<Diligent::SerializedResourceSignatureImpl,Diligent::IPipelineResourceSignature>
                     (ppIVar1[uVar10]);
    if (this == (SerializedResourceSignatureImpl *)0x0) {
      FormatString<char[26],char[19]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pSerPRS != nullptr",
                 in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SortResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                 ,0x38);
      std::__cxx11::string::~string((string *)&msg);
    }
    pPVar4 = SerializedResourceSignatureImpl::GetDesc(this);
    Args = &pPVar4->BindingIndex;
    if (local_78._M_elems[pPVar4->BindingIndex].m_pObject != (PipelineResourceSignatureGLImpl *)0x0)
    {
      FormatString<char[49],unsigned_char,char[3]>
                (&msg,(Diligent *)"Multiple signatures use the same binding index (",
                 (char (*) [49])Args,").",in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SortResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                 ,0x3c);
      std::__cxx11::string::~string((string *)&msg);
    }
    pPVar5 = SerializedResourceSignatureImpl::
             GetDeviceSignature<Diligent::PipelineResourceSignatureGLImpl>(this,OpenGL);
    in_RCX = (char (*) [19])(ulong)*Args;
    RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=
              (local_78._M_elems + (long)in_RCX,pPVar5);
    if (uVar7 <= *Args + 1) {
      uVar7 = *Args + 1;
    }
  }
  BaseBindings._M_elems[0] = 0;
  BaseBindings._M_elems[1] = 0;
  BaseBindings._M_elems[2] = 0;
  BaseBindings._M_elems[3] = 0;
  if (SVar9 == SHADER_TYPE_UNKNOWN) {
    SVar2 = SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS;
  }
  for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    pPVar5 = local_78._M_elems[uVar10].m_pObject;
    if (pPVar5 != (PipelineResourceSignatureGLImpl *)0x0) {
      for (uVar8 = 0;
          uVar8 < (pPVar5->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                  .m_Desc.NumResources; uVar8 = uVar8 + 1) {
        Desc = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                         (&pPVar5->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>
                          ,uVar8);
        pPVar6 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                           (&(local_78._M_elems[uVar10].m_pObject)->
                             super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,uVar8
                           );
        BVar3 = PipelineResourceToBindingRange(Desc);
        SVar9 = SVar2;
        while (SVar9 != SHADER_TYPE_UNKNOWN) {
          Stages = -SVar9 & SVar9;
          SVar9 = SVar9 ^ Stages;
          if ((Desc->ShaderStages & Stages) != SHADER_TYPE_UNKNOWN) {
            ResDescToPipelineResBinding
                      ((PipelineResourceBinding *)&msg,Desc,Stages,
                       (uint)BaseBindings._M_elems[BVar3] + pPVar6->CacheOffset,0);
            std::
            vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
            ::emplace_back<Diligent::PipelineResourceBinding>
                      (ResourceBindings,(PipelineResourceBinding *)&msg);
          }
        }
        pPVar5 = local_78._M_elems[uVar10].m_pObject;
      }
      PipelineResourceSignatureGLImpl::ShiftBindings(pPVar5,&BaseBindings);
    }
  }
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL>::~array
            (&local_78);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsGL(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto            ShaderStages        = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);
    constexpr SHADER_TYPE SupportedStagesMask = (SHADER_TYPE_ALL_GRAPHICS | SHADER_TYPE_COMPUTE);

    SignatureArray<PipelineResourceSignatureGLImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    PipelineResourceSignatureGLImpl::TBindings BaseBindings = {};
    for (Uint32 s = 0; s < SignaturesCount; ++s)
    {
        const auto& pSignature = Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            const auto  Range   = PipelineResourceToBindingRange(ResDesc);

            for (auto Stages = ShaderStages & SupportedStagesMask; Stages != 0;)
            {
                const auto ShaderStage = ExtractLSB(Stages);
                if ((ResDesc.ShaderStages & ShaderStage) == 0)
                    continue;

                ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ShaderStage, BaseBindings[Range] + ResAttr.CacheOffset, 0 /*space*/));
            }
        }
        pSignature->ShiftBindings(BaseBindings);
    }
}